

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

char * o_xtra_prompt(wchar_t oid)

{
  object_kind *poVar1;
  char *pcVar2;
  
  poVar1 = objkind_byid(oid);
  if (poVar1 == (object_kind *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = ", \'s\' to toggle ignore, \'r\'ecall, \'{\', \'}\'";
    if ((&poVar1->note_aware)[poVar1->aware ^ 1] == 0) {
      pcVar2 = ", \'s\' to toggle ignore, \'r\'ecall, \'{\'";
    }
  }
  return pcVar2;
}

Assistant:

static const char *o_xtra_prompt(int oid)
{
	struct object_kind *kind = objkind_byid(oid);

	const char *no_insc = ", 's' to toggle ignore, 'r'ecall, '{'";
	const char *with_insc = ", 's' to toggle ignore, 'r'ecall, '{', '}'";

	if (!kind) return NULL;

	/* Appropriate prompt */
	if (kind->aware)
		return kind->note_aware ? with_insc : no_insc;
	else
		return kind->note_unaware ? with_insc : no_insc;
}